

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall Memory::Recycler::FinishDisposeObjects(Recycler *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined7 uVar6;
  CollectionFlags CVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  undefined4 uVar13;
  bool bVar14;
  CollectionParam savedCollectionParam;
  
  bVar14 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,DisposePhase);
  if (bVar14) {
    Output::Print(L"[Dispose] AllowDispose in FinishDisposeObject: %d\n",(ulong)this->allowDispose);
    Output::Flush();
  }
  if (this->hasDisposableObject == true) {
    if (this->allowDispose == true) {
      bVar14 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,DisposePhase);
      if (bVar14) {
        Output::Print(L"[Dispose] FinishDisposeObject, calling Dispose: %d\n",
                      (ulong)this->allowDispose);
        Output::Flush();
      }
      CVar7 = (this->collectionParam).flags;
      bVar8 = (this->collectionParam).finishOnly;
      bVar9 = (this->collectionParam).repeat;
      bVar10 = (this->collectionParam).priorityBoostConcurrentSweepOverride;
      bVar11 = (this->collectionParam).domCollect;
      iVar12 = (this->collectionParam).timeDiff;
      uVar13 = *(undefined4 *)&(this->collectionParam).field_0xc;
      sVar1 = (this->collectionParam).uncollectedAllocBytes;
      sVar2 = (this->collectionParam).uncollectedPinnedObjects;
      sVar3 = (this->collectionParam).uncollectedNewPageCountPartialCollect;
      sVar4 = (this->collectionParam).uncollectedNewPageCount;
      sVar5 = (this->collectionParam).unusedPartialCollectFreeBytes;
      bVar14 = (this->collectionParam).inPartialCollectMode;
      uVar6 = *(undefined7 *)&(this->collectionParam).field_0x39;
      DisposeObjects(this);
      (this->collectionParam).unusedPartialCollectFreeBytes = sVar5;
      (this->collectionParam).inPartialCollectMode = bVar14;
      *(undefined7 *)&(this->collectionParam).field_0x39 = uVar6;
      (this->collectionParam).uncollectedNewPageCountPartialCollect = sVar3;
      (this->collectionParam).uncollectedNewPageCount = sVar4;
      (this->collectionParam).uncollectedAllocBytes = sVar1;
      (this->collectionParam).uncollectedPinnedObjects = sVar2;
      (this->collectionParam).flags = CVar7;
      (this->collectionParam).finishOnly = bVar8;
      (this->collectionParam).repeat = bVar9;
      (this->collectionParam).priorityBoostConcurrentSweepOverride = bVar10;
      (this->collectionParam).domCollect = bVar11;
      (this->collectionParam).timeDiff = iVar12;
      *(undefined4 *)&(this->collectionParam).field_0xc = uVar13;
      return true;
    }
    if ((this->inDispose == false) &&
       (bVar14 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase), bVar14)) {
      Output::Print(L"%04X> RC(%p): %s %d\n",this->mainThreadId,this,L"Dispose object delayed",
                    (ulong)(this->collectionState).value);
      return false;
    }
  }
  return false;
}

Assistant:

bool
Recycler::FinishDisposeObjects()
{
    CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::DisposePhase, _u("[Dispose] AllowDispose in FinishDisposeObject: %d\n"), this->allowDispose);

    if (this->hasDisposableObject && this->allowDispose)
    {
        CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::DisposePhase, _u("[Dispose] FinishDisposeObject, calling Dispose: %d\n"), this->allowDispose);
#ifdef RECYCLER_TRACE
        CollectionParam savedCollectionParam = collectionParam;
#endif
        DisposeObjects();
#ifdef RECYCLER_TRACE
        collectionParam = savedCollectionParam;
#endif
        // FinishDisposeObjects is always called either during a collection,
        // or we will check the NeedExhaustiveRepeatCollect(), so no need to check it here
        return true;
    }


#ifdef RECYCLER_TRACE
    if (!this->inDispose && this->hasDisposableObject
        && GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
    {
        Output::Print(_u("%04X> RC(%p): %s %d\n"), this->mainThreadId, this, _u("Dispose object delayed"), static_cast<CollectionState>(this->collectionState));
    }
#endif
    return false;
}